

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

void __thiscall CVmObjByteArray::save_to_file(CVmObjByteArray *this,CVmFile *fp)

{
  int32_t tmp;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong buflen;
  char b [4];
  undefined4 local_2c;
  
  local_2c = *(undefined4 *)(this->super_CVmObject).ext_;
  CVmFile::write_bytes(fp,(char *)&local_2c,4);
  uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
  if (uVar3 != 0) {
    lVar4 = 1;
    do {
      uVar1 = (uint)(lVar4 - 1U);
      uVar2 = (ulong)(uVar1 & 0x7fff);
      buflen = 0x8000 - uVar2;
      if (uVar3 <= buflen) {
        buflen = uVar3;
      }
      CVmFile::write_bytes
                (fp,(char *)(uVar2 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                        (lVar4 - 1U >> 0x1c) * 8 + 4) +
                                              (ulong)(uVar1 >> 0xc & 0xfff8))),buflen);
      lVar4 = lVar4 + buflen;
      uVar3 = uVar3 - buflen;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void CVmObjByteArray::save_to_file(VMG_ class CVmFile *fp)
{
    unsigned long rem;
    unsigned long idx;
    
    /* write the element count */
    fp->write_int4(get_element_count());

    /* write the bytes in chunks */
    for (idx = 1, rem = get_element_count() ; rem != 0 ; )
    {
        size_t avail;
        size_t chunk;
        unsigned char *p;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit this copy to the remaining bytes */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* write this chunk */
        fp->write_bytes((char *)p, chunk);

        /* advance past this chunk */
        idx += chunk;
        rem -= chunk;
    }
}